

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.h
# Opt level: O0

uint __thiscall
Jupiter::Config::get<unsigned_int>(Config *this,string_view in_key,uint in_default_value)

{
  bool bVar1;
  pointer pvVar2;
  __sv_type in_string;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_40;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_38;
  const_iterator result;
  uint in_default_value_local;
  Config *this_local;
  string_view in_key_local;
  
  in_key_local._M_len = (size_t)in_key._M_str;
  this_local = (Config *)in_key._M_len;
  result.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  ._M_cur._4_4_ = in_default_value;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::string,std::__cxx11::string,jessilib::text_hashi,jessilib::text_equali,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
       ::find<std::basic_string_view<char,std::char_traits<char>>>
                 ((unordered_map<std::__cxx11::string,std::__cxx11::string,jessilib::text_hashi,jessilib::text_equali,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                   *)(this + 0x28),(basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(this + 0x28));
  bVar1 = std::__detail::operator==(&local_38,&local_40);
  if (bVar1) {
    in_key_local._M_str._4_4_ =
         result.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
         ._M_cur._4_4_;
  }
  else {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                           *)&local_38);
    in_string = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&pvVar2->second);
    in_key_local._M_str._4_4_ = from_string<unsigned_int>(in_string);
  }
  return in_key_local._M_str._4_4_;
}

Assistant:

inline T Jupiter::Config::get(std::string_view in_key, T in_default_value) const {
	auto result = m_table.find(JUPITER_WRAP_MAP_KEY(in_key));

	if (result == m_table.end()) {
		return in_default_value;
	}

	return from_string<T>(result->second);
}